

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

int nondefp(sexp x)

{
  int iVar1;
  int *in_RDI;
  bool bVar2;
  sexp ls;
  sexp x_00;
  int local_4;
  
  if (((((ulong)in_RDI & 3) == 0) && (*in_RDI == 6)) ||
     ((((ulong)in_RDI & 3) == 0 && (*in_RDI == 0x1d)))) {
    local_4 = 1;
  }
  else if ((((ulong)in_RDI & 3) == 0) && (*in_RDI == 0x21)) {
    x_00 = *(sexp *)(in_RDI + 2);
    while( true ) {
      bVar2 = false;
      if (((ulong)x_00 & 3) == 0) {
        bVar2 = x_00->tag == 6;
      }
      if (!bVar2) goto LAB_001541ee;
      iVar1 = nondefp(x_00);
      if (iVar1 != 0) break;
      x_00 = (x_00->value).type.cpl;
    }
    local_4 = 1;
  }
  else {
LAB_001541ee:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nondefp(sexp x) {
  sexp ls;
  if (sexp_pairp(x) || sexp_cndp(x))
    return 1;
  if (sexp_seqp(x))
    for (ls=sexp_seq_ls(x); sexp_pairp(ls); ls=sexp_cdr(ls))
      if (nondefp(sexp_car(ls)))
        return 1;
  return 0;
}